

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_err.cpp
# Opt level: O0

void UCNV_TO_U_CALLBACK_ESCAPE_63
               (void *context,UConverterToUnicodeArgs *toArgs,char *codeUnits,int32_t length,
               UConverterCallbackReason reason,UErrorCode *err)

{
  char cVar1;
  int32_t iVar2;
  int iVar3;
  int local_a0;
  int local_9c;
  int32_t i;
  int32_t valueStringLength;
  UChar uniValueString [48];
  UErrorCode *err_local;
  UConverterCallbackReason reason_local;
  int32_t length_local;
  char *codeUnits_local;
  UConverterToUnicodeArgs *toArgs_local;
  void *context_local;
  
  local_9c = 0;
  local_a0 = 0;
  if ((int)reason < 3) {
    if (context == (void *)0x0) {
      while (local_a0 < length) {
        *(undefined2 *)((long)&i + (long)local_9c * 2) = 0x25;
        iVar3 = local_9c + 2;
        *(undefined2 *)((long)&i + (long)(local_9c + 1) * 2) = 0x58;
        iVar2 = uprv_itou_63((UChar *)((long)&i + (long)iVar3 * 2),0x30 - iVar3,
                             (uint)(byte)codeUnits[local_a0],0x10,2);
        local_9c = iVar2 + iVar3;
        local_a0 = local_a0 + 1;
      }
    }
    else {
      cVar1 = *context;
      if (cVar1 == 'C') {
        while (local_a0 < length) {
          *(undefined2 *)((long)&i + (long)local_9c * 2) = 0x5c;
          iVar3 = local_9c + 2;
          *(undefined2 *)((long)&i + (long)(local_9c + 1) * 2) = 0x78;
          iVar2 = uprv_itou_63((UChar *)((long)&i + (long)iVar3 * 2),0x30 - iVar3,
                               (uint)(byte)codeUnits[local_a0],0x10,2);
          local_9c = iVar2 + iVar3;
          local_a0 = local_a0 + 1;
        }
      }
      else if (cVar1 == 'D') {
        while (local_a0 < length) {
          *(undefined2 *)((long)&i + (long)local_9c * 2) = 0x26;
          iVar3 = local_9c + 2;
          *(undefined2 *)((long)&i + (long)(local_9c + 1) * 2) = 0x23;
          iVar2 = uprv_itou_63((UChar *)((long)&i + (long)iVar3 * 2),0x30 - iVar3,
                               (uint)(byte)codeUnits[local_a0],10,0);
          local_9c = iVar2 + iVar3 + 1;
          *(undefined2 *)((long)&i + (long)(iVar2 + iVar3) * 2) = 0x3b;
          local_a0 = local_a0 + 1;
        }
      }
      else if (cVar1 == 'X') {
        while (local_a0 < length) {
          *(undefined2 *)((long)&i + (long)local_9c * 2) = 0x26;
          *(undefined2 *)((long)&i + (long)(local_9c + 1) * 2) = 0x23;
          iVar3 = local_9c + 3;
          *(undefined2 *)((long)&i + (long)(local_9c + 2) * 2) = 0x78;
          iVar2 = uprv_itou_63((UChar *)((long)&i + (long)iVar3 * 2),0x30 - iVar3,
                               (uint)(byte)codeUnits[local_a0],0x10,0);
          local_9c = iVar2 + iVar3 + 1;
          *(undefined2 *)((long)&i + (long)(iVar2 + iVar3) * 2) = 0x3b;
          local_a0 = local_a0 + 1;
        }
      }
      else {
        while (local_a0 < length) {
          *(undefined2 *)((long)&i + (long)local_9c * 2) = 0x25;
          *(undefined2 *)((long)&i + (long)(local_9c + 1) * 2) = 0x58;
          uprv_itou_63((UChar *)((long)&i + (long)(local_9c + 2) * 2),0x30 - (local_9c + 2),
                       (uint)(byte)codeUnits[local_a0],0x10,2);
          local_9c = local_9c + 4;
          local_a0 = local_a0 + 1;
        }
      }
    }
    *err = U_ZERO_ERROR;
    ucnv_cbToUWriteUChars_63(toArgs,(UChar *)&i,local_9c,0,err);
  }
  return;
}

Assistant:

U_CAPI void   U_EXPORT2
UCNV_TO_U_CALLBACK_ESCAPE (
                 const void *context,
                 UConverterToUnicodeArgs *toArgs,
                 const char* codeUnits,
                 int32_t length,
                 UConverterCallbackReason reason,
                 UErrorCode * err)
{
    UChar uniValueString[VALUE_STRING_LENGTH];
    int32_t valueStringLength = 0;
    int32_t i = 0;

    if (reason > UCNV_IRREGULAR)
    {
        return;
    }

    if(context==NULL)
    {    
        while (i < length)
        {
            uniValueString[valueStringLength++] = (UChar) UNICODE_PERCENT_SIGN_CODEPOINT; /* adding % */
            uniValueString[valueStringLength++] = (UChar) UNICODE_X_CODEPOINT;    /* adding X */
            valueStringLength += uprv_itou (uniValueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint8_t) codeUnits[i++], 16, 2);
        }
    }
    else
    {
        switch(*((char*)context))
        {
        case UCNV_PRV_ESCAPE_XML_DEC:
            while (i < length)
            {
                uniValueString[valueStringLength++] = (UChar) UNICODE_AMP_CODEPOINT;   /* adding & */
                uniValueString[valueStringLength++] = (UChar) UNICODE_HASH_CODEPOINT;  /* adding # */
                valueStringLength += uprv_itou (uniValueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint8_t)codeUnits[i++], 10, 0);
                uniValueString[valueStringLength++] = (UChar) UNICODE_SEMICOLON_CODEPOINT; /* adding ; */
            }
            break;

        case UCNV_PRV_ESCAPE_XML_HEX:
            while (i < length)
            {
                uniValueString[valueStringLength++] = (UChar) UNICODE_AMP_CODEPOINT;   /* adding & */
                uniValueString[valueStringLength++] = (UChar) UNICODE_HASH_CODEPOINT;  /* adding # */
                uniValueString[valueStringLength++] = (UChar) UNICODE_X_LOW_CODEPOINT; /* adding x */
                valueStringLength += uprv_itou (uniValueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint8_t)codeUnits[i++], 16, 0);
                uniValueString[valueStringLength++] = (UChar) UNICODE_SEMICOLON_CODEPOINT; /* adding ; */
            }
            break;
        case UCNV_PRV_ESCAPE_C:
            while (i < length)
            {
                uniValueString[valueStringLength++] = (UChar) UNICODE_RS_CODEPOINT;    /* adding \ */
                uniValueString[valueStringLength++] = (UChar) UNICODE_X_LOW_CODEPOINT; /* adding x */
                valueStringLength += uprv_itou (uniValueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint8_t)codeUnits[i++], 16, 2);
            }
            break;
        default:
            while (i < length)
            {
                uniValueString[valueStringLength++] = (UChar) UNICODE_PERCENT_SIGN_CODEPOINT; /* adding % */
                uniValueString[valueStringLength++] = (UChar) UNICODE_X_CODEPOINT;    /* adding X */
                uprv_itou (uniValueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint8_t) codeUnits[i++], 16, 2);
                valueStringLength += 2;
            }
        }
    }
    /* reset the error */
    *err = U_ZERO_ERROR;

    ucnv_cbToUWriteUChars(toArgs, uniValueString, valueStringLength, 0, err);
}